

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

Model * MeCab::createModel(char *arg)

{
  int iVar1;
  ModelImpl *this;
  int __oflag;
  
  this = (ModelImpl *)operator_new(0x30);
  anon_unknown_0::ModelImpl::ModelImpl(this);
  iVar1 = anon_unknown_0::ModelImpl::open(this,arg,__oflag);
  if ((char)iVar1 == '\0') {
    (*(this->super_Model)._vptr_Model[7])(this);
    this = (ModelImpl *)0x0;
  }
  return &this->super_Model;
}

Assistant:

Model *createModel(const char *arg) {
  ModelImpl *model = new ModelImpl;
  if (!model->open(arg)) {
    delete model;
    return 0;
  }
  return model;
}